

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_hpf1_config *
ma_hpf1_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double cutoffFrequency)

{
  ma_hpf1_config *in_RDI;
  
  if (in_RDI != (ma_hpf1_config *)0x0) {
    in_RDI->cutoffFrequency = 0.0;
    in_RDI->q = 0.0;
    in_RDI->format = ma_format_unknown;
    in_RDI->channels = 0;
    *(undefined8 *)&in_RDI->sampleRate = 0;
  }
  in_RDI->format = format;
  in_RDI->channels = channels;
  in_RDI->sampleRate = sampleRate;
  in_RDI->cutoffFrequency = cutoffFrequency;
  return in_RDI;
}

Assistant:

MA_API ma_hpf1_config ma_hpf1_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency)
{
    ma_hpf1_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRate = sampleRate;
    config.cutoffFrequency = cutoffFrequency;

    return config;
}